

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O3

void cubeb_strings_destroy(cubeb_strings *strings)

{
  uint uVar1;
  long lVar2;
  char **__ptr;
  
  if (strings != (cubeb_strings *)0x0) {
    __ptr = strings->data;
    uVar1 = strings->count;
    if ((ulong)uVar1 != 0) {
      lVar2 = 0;
      do {
        if (*(void **)((long)__ptr + lVar2) != (void *)0x0) {
          free(*(void **)((long)__ptr + lVar2));
        }
        lVar2 = lVar2 + 8;
      } while ((ulong)uVar1 << 3 != lVar2);
      __ptr = strings->data;
    }
    if (__ptr != strings->small_store) {
      free(__ptr);
    }
    free(strings);
    return;
  }
  return;
}

Assistant:

void
cubeb_strings_destroy(cubeb_strings * strings)
{
  char ** sp = NULL;
  char ** se = NULL;

  if (!strings) {
    return;
  }

  sp = strings->data;
  se = sp + strings->count;

  for ( ;  sp != se; sp++) {
    if (*sp) {
      free(*sp);
    }
  }

  if (strings->data != strings->small_store) {
    free(strings->data);
  }

  free(strings);
}